

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::ChildPopper::popConstrainedChildren
          (Result<wasm::Ok> *__return_storage_ptr__,ChildPopper *this,
          vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
          *children)

{
  undefined8 *puVar1;
  pointer ppEVar2;
  bool bVar3;
  Result<wasm::Ok> *pRVar4;
  bool bVar5;
  byte bVar6;
  HeapTypeKind HVar7;
  uint uVar8;
  ScopeCtx *pSVar9;
  Constraint *this_00;
  Expression *pEVar10;
  Type *pTVar11;
  _Uninitialized<wasm::Expression_*,_true> _Var12;
  undefined7 extraout_var;
  HeapType HVar13;
  undefined1 *puVar14;
  size_t size;
  undefined1 extraout_DL;
  size_t i;
  long lVar15;
  _Uninitialized<wasm::Expression_*,_true> _Var16;
  long lVar17;
  long lVar18;
  bool bVar19;
  undefined1 local_e0 [8];
  Result<wasm::Expression_*> val;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  ChildPopper *local_98;
  long local_90;
  Result<wasm::Ok> *local_88;
  ulong local_80;
  uintptr_t local_78;
  undefined1 local_70 [8];
  Type type;
  __index_type local_50;
  long local_48;
  
  local_98 = this;
  pSVar9 = getScope(this->builder);
  local_88 = __return_storage_ptr__;
  if (pSVar9->unreachable == true) {
    local_48 = ((long)(children->
                      super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(children->
                      super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    lVar15 = (long)(pSVar9->exprStack).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar9->exprStack).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    local_80 = 0;
    bVar3 = false;
    this_00 = (Constraint *)0x0;
    _Var16._M_storage = (Expression *)0x0;
    do {
      if (this_00 == (Constraint *)0x0) {
        if (local_48 == 0) break;
        this_00 = (Constraint *)
                  Constraint::size(&(children->
                                    super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                                    )._M_impl.super__Vector_impl_data._M_start[local_48 + -1].
                                    constraint);
        local_48 = local_48 + -1;
      }
      this_00 = (Constraint *)
                ((long)&this_00[-1].
                        super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                        .
                        super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                        .
                        super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                        .
                        super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                        .
                        super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                        .
                        super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                        .
                        super__Variant_storage_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                + 0xf);
      do {
        pEVar10 = _Var16._M_storage;
        if (pEVar10 == (Expression *)0x0) {
          if (lVar15 == 0) {
            bVar3 = true;
            goto LAB_00ca4fbf;
          }
          lVar17 = lVar15 + -1;
          lVar15 = lVar15 + -1;
          pEVar10 = (Expression *)
                    wasm::Type::size(&(pSVar9->exprStack).
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar17]->type);
        }
        ppEVar2 = (pSVar9->exprStack).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        _Var16._M_storage = (Expression *)0x0;
      } while ((ppEVar2[lVar15]->type).id == 0);
      _Var16._M_storage = (Expression *)((long)&pEVar10[-1].type.id + 7);
      local_e0 = (undefined1  [8])&ppEVar2[lVar15]->type;
      val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage =
           (_Uninitialized<wasm::Expression_*,_true>)_Var16._M_storage;
      pTVar11 = wasm::Type::Iterator::operator*((Iterator *)local_e0);
      _Var12._M_storage = (Expression *)pTVar11->id;
      local_70 = (undefined1  [8])_Var12._M_storage;
      if ((local_80 & 1) == 0) {
LAB_00ca4f82:
        bVar19 = true;
        if (local_70 == (undefined1  [8])0x1) {
          local_80 = CONCAT71((int7)((ulong)_Var12._M_storage >> 8),1);
          bVar19 = true;
          local_90 = lVar15;
          if (bVar3) {
            __assert_fail("!needUnreachableFallback",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                          ,0x1fc,
                          "Result<> wasm::IRBuilder::ChildPopper::popConstrainedChildren(std::vector<Child> &)"
                         );
          }
        }
      }
      else {
        _Var12._M_storage =
             (Expression *)
             Constraint::operator[]
                       (&(children->
                         super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                         )._M_impl.super__Vector_impl_data._M_start[local_48].constraint,this_00,i);
        switch(extraout_DL) {
        case 0:
          bVar19 = wasm::Type::isSubType((Type)local_70,(Type)_Var12._M_storage);
          _Var12._M_storage = (Expression *)CONCAT71(extraout_var,bVar19);
          if (bVar19) goto LAB_00ca4f6a;
          bVar3 = true;
          _Var12._M_storage = (Expression *)0x0;
          goto LAB_00ca4f6c;
        case 1:
          goto switchD_00ca4df9_caseD_1;
        case 2:
          _Var12._M_storage = (Expression *)local_70;
          if ((local_70 == (undefined1  [8])0x1) ||
             ((Expression *)0x6 < (ulong)local_70 && ((ulong)local_70 & 1) == 0))
          goto switchD_00ca4df9_caseD_1;
          _Var12._M_storage = (Expression *)0x0;
          bVar3 = true;
          goto LAB_00ca4f7e;
        default:
          handle_unreachable("unexpected constraint",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                             ,0x1f6);
        case 4:
          if (((ulong)local_70 & 1) != 0 || (ulong)local_70 < (Expression *)0x7) goto LAB_00ca4f16;
          val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ =
               wasm::Type::getHeapType((Type *)local_70);
          HVar7 = HeapType::getKind((HeapType *)
                                    ((long)&val.val.
                                            super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> +
                                    0x20));
          if (HVar7 != Array) goto LAB_00ca4f16;
          local_78 = (uintptr_t)wasm::Type::getHeapType((Type *)local_70);
          HeapType::getArray((HeapType *)local_e0);
          bVar19 = val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                   super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._0_4_ == 1;
          break;
        case 5:
          if (((ulong)local_70 & 1) == 0 && (Expression *)0x6 < (ulong)local_70) {
            val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ =
                 wasm::Type::getHeapType((Type *)local_70);
            HVar7 = HeapType::getKind((HeapType *)
                                      ((long)&val.val.
                                              super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>
                                              .
                                              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>
                                              .super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>
                                              .super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>
                                      + 0x20));
            if (HVar7 == Array) {
              local_78 = (uintptr_t)wasm::Type::getHeapType((Type *)local_70);
              HeapType::getArray((HeapType *)local_e0);
              bVar19 = val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._0_4_ == 2;
              break;
            }
          }
LAB_00ca4f16:
          bVar19 = false;
        }
        if (((ulong)local_70 & 1) == 0 && (Expression *)0x6 < (ulong)local_70) {
          HVar13 = wasm::Type::getHeapType((Type *)local_70);
          bVar5 = ((uint)HVar13.id & 0x7b) == 0x58 && HVar13.id < 0x7d;
        }
        else {
          bVar5 = false;
        }
        bVar6 = local_70 == (undefined1  [8])0x1 | bVar19 | bVar5;
        _Var12._M_storage = (Expression *)(ulong)bVar6;
        if (bVar6 == 0) {
          bVar3 = true;
        }
        else {
LAB_00ca4f6a:
          _Var12._M_storage = (Expression *)CONCAT71((int7)((ulong)_Var12._M_storage >> 8),1);
        }
LAB_00ca4f6c:
        if ((char)_Var12._M_storage == '\0') {
          _Var12._M_storage = (Expression *)0x0;
        }
        else {
switchD_00ca4df9_caseD_1:
          _Var12._M_storage = (Expression *)CONCAT71((int7)((ulong)_Var12._M_storage >> 8),1);
        }
LAB_00ca4f7e:
        if ((char)_Var12._M_storage != '\0') goto LAB_00ca4f82;
        bVar19 = false;
      }
    } while (bVar19);
  }
  else {
    bVar3 = false;
  }
LAB_00ca4fbf:
  uVar8 = (int)((ulong)((long)(children->
                              super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(children->
                             super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 - 1;
  if (-1 < (int)uVar8) {
    local_90 = local_90 + 1;
    lVar15 = (ulong)uVar8 * 0x18 + 8;
    lVar17 = (ulong)uVar8 + 1;
    do {
      if (((bVar3) && (lVar17 != 1)) &&
         ((long)(pSVar9->exprStack).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pSVar9->exprStack).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 == local_90)) {
        puVar14 = (undefined1 *)
                  MixedArena::allocSpace(&((local_98->builder->builder).wasm)->allocator,0x10,8);
        *puVar14 = 0x17;
        *(undefined8 *)(puVar14 + 8) = 1;
        **(undefined8 **)
          ((long)(children->
                 super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar15 + -8) = puVar14;
      }
      else {
        size = Constraint::size((Constraint *)
                                ((long)&((children->
                                         super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->childp +
                                lVar15));
        pop((Result<wasm::Expression_*> *)local_e0,local_98,size);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)local_70,
                        (_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)local_e0);
        if (local_50 == '\x01') {
          val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ = &local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),local_70,
                     type.id + (long)local_70);
          pRVar4 = local_88;
          puVar1 = (undefined8 *)
                   ((long)&(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
          if ((undefined1 *)
              val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ == &local_a8) {
            *puVar1 = CONCAT71(uStack_a7,local_a8);
            *(undefined8 *)
             ((long)&(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_a0;
          }
          else {
            *(undefined8 *)
             &(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
                 val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_;
            *(ulong *)((long)&(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
                 CONCAT71(uStack_a7,local_a8);
          }
          *(undefined8 *)
           ((long)&(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_b0;
          local_a8 = 0;
          *(__index_type *)
           ((long)&(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
          val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ = &local_a8;
          std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_70);
          std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_e0);
          return pRVar4;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_70);
        (*(_Uninitialized<wasm::Expression_*,_true> **)
          ((long)(children->
                 super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar15 + -8))->_M_storage =
             (Expression *)local_e0;
        std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_e0);
      }
      lVar15 = lVar15 + -0x18;
      lVar18 = lVar17 + -1;
      bVar19 = 0 < lVar17;
      lVar17 = lVar18;
    } while (lVar18 != 0 && bVar19);
  }
  *(__index_type *)
   ((long)&(local_88->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return local_88;
}

Assistant:

Result<> popConstrainedChildren(std::vector<Child>& children) {
    auto& scope = builder.getScope();

    // Two-part indices into the stack of available expressions and the vector
    // of requirements, allowing them to move independently with the granularity
    // of a single tuple element.
    size_t stackIndex = scope.exprStack.size();
    size_t stackTupleIndex = 0;
    size_t childIndex = children.size();
    size_t childTupleIndex = 0;

    // The index of the shallowest unreachable instruction on the stack.
    std::optional<size_t> unreachableIndex;

    // Whether popping the children past the unreachable would produce a type
    // mismatch or try to pop from an empty stack.
    bool needUnreachableFallback = false;

    if (!scope.unreachable) {
      // We only need to check requirements if there is an unreachable.
      // Otherwise the validator will catch any problems.
      goto pop;
    }

    // Check whether the values on the stack will be able to meet the given
    // requirements.
    while (true) {
      // Advance to the next requirement.
      if (childTupleIndex > 0) {
        --childTupleIndex;
      } else {
        if (childIndex == 0) {
          // We have examined all the requirements.
          break;
        }
        --childIndex;
        childTupleIndex = children[childIndex].constraint.size() - 1;
      }

      // Advance to the next available value on the stack.
      while (true) {
        if (stackTupleIndex > 0) {
          --stackTupleIndex;
        } else {
          if (stackIndex == 0) {
            // No more available values. This is valid iff we are reaching past
            // an unreachable, but we still need the fallback behavior to ensure
            // the input unreachable instruction is executed first. If we are
            // not reaching past an unreachable, the error will be caught when
            // we pop.
            needUnreachableFallback = true;
            goto pop;
          }
          --stackIndex;
          stackTupleIndex = scope.exprStack[stackIndex]->type.size() - 1;
        }

        // Skip expressions that don't produce values.
        if (scope.exprStack[stackIndex]->type == Type::none) {
          stackTupleIndex = 0;
          continue;
        }
        break;
      }

      // We have an available type and a constraint. Only check constraints if
      // we are past an unreachable, since otherwise we can leave problems to be
      // caught by the validator later.
      auto type = scope.exprStack[stackIndex]->type[stackTupleIndex];
      if (unreachableIndex) {
        auto constraint = children[childIndex].constraint[childTupleIndex];
        if (constraint.isAnyType()) {
          // Always succeeds.
        } else if (constraint.isAnyReference()) {
          if (!type.isRef() && type != Type::unreachable) {
            needUnreachableFallback = true;
            break;
          }
        } else if (auto bound = constraint.getSubtype()) {
          if (!Type::isSubType(type, *bound)) {
            needUnreachableFallback = true;
            break;
          }
        } else if (constraint.isAnyI8ArrayReference()) {
          bool isI8Array =
            type.isRef() && type.getHeapType().isArray() &&
            type.getHeapType().getArray().element.packedType == Field::i8;
          bool isNone =
            type.isRef() && type.getHeapType().isMaybeShared(HeapType::none);
          if (!isI8Array && !isNone && type != Type::unreachable) {
            needUnreachableFallback = true;
            break;
          }
        } else if (constraint.isAnyI16ArrayReference()) {
          bool isI16Array =
            type.isRef() && type.getHeapType().isArray() &&
            type.getHeapType().getArray().element.packedType == Field::i16;
          bool isNone =
            type.isRef() && type.getHeapType().isMaybeShared(HeapType::none);
          if (!isI16Array && !isNone && type != Type::unreachable) {
            needUnreachableFallback = true;
            break;
          }
        } else {
          WASM_UNREACHABLE("unexpected constraint");
        }
      }

      // No problems for children after this unreachable.
      if (type == Type::unreachable) {
        assert(!needUnreachableFallback);
        unreachableIndex = stackIndex;
      }
    }

  pop:
    // We have checked all the constraints, so we are ready to pop children.
    for (int i = children.size() - 1; i >= 0; --i) {
      if (needUnreachableFallback &&
          scope.exprStack.size() == *unreachableIndex + 1 && i > 0) {
        // The next item on the stack is the unreachable instruction we must
        // not pop past. We cannot insert unreachables in front of it because
        // it might be a branch we actually have to execute, so this next item
        // must be child 0. But we are not ready to pop child 0 yet, so
        // synthesize an unreachable instead of popping. The deeper
        // instructions that would otherwise have been popped will remain on
        // the stack to become prior children of future expressions or to be
        // implicitly dropped at the end of the scope.
        *children[i].childp = builder.builder.makeUnreachable();
        continue;
      }

      // Pop a child normally.
      auto val = pop(children[i].constraint.size());
      CHECK_ERR(val);
      *children[i].childp = *val;
    }
    return Ok{};
  }